

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SharedPtrTests_advanced_Move_Test::TestBody(SharedPtrTests_advanced_Move_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d0;
  Message local_c8;
  int *local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  void *local_98;
  int *local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  int local_64;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  SharedPtr<int> t2;
  SharedPtr<int> t1;
  int *a;
  SharedPtrTests_advanced_Move_Test *this_local;
  
  t1.pointersAmount = (atomic<unsigned_long> *)operator_new(4);
  *(int *)&((t1.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 0x4d2;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)&t2.pointersAmount,(int *)t1.pointersAmount);
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)local_38,(SharedPtr<int> *)&t2.pointersAmount);
  local_60 = SharedPtr<int>::use_count((SharedPtr<int> *)local_38);
  local_64 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_58,"t2.use_count()","1",&local_60,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_90 = SharedPtr<int>::get((SharedPtr<int> *)&t2.pointersAmount);
  local_98 = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<int*,decltype(nullptr)>
            ((EqHelper<false> *)local_88,"t1.get()","nullptr",&local_90,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = SharedPtr<int>::get((SharedPtr<int> *)local_38);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_b8,"t2.get()","a",&local_c0,(int **)&t1.pointersAmount);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)local_38);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&t2.pointersAmount);
  return;
}

Assistant:

TEST(SharedPtrTests_advanced, Move) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(std::move(t1));
	EXPECT_EQ(t2.use_count(), 1);
	EXPECT_EQ(t1.get(), nullptr);
	EXPECT_EQ(t2.get(), a);
}